

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_rpc_server::check_call(json_rpc_server *this)

{
  cppcms_error *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    return;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"JSON-RPC Request is not assigned to class",&local_39);
  cppcms_error::cppcms_error(this_00,&local_38);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void json_rpc_server::check_call()
	{
		if(current_call_.get()==0)
			throw cppcms_error("JSON-RPC Request is not assigned to class");
	}